

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaggeredGrid.h
# Opt level: O0

void __thiscall
Field<unsigned_long,_unsigned_short>::Field
          (Field<unsigned_long,_unsigned_short> *this,unsigned_short Xsize,unsigned_short Ysize,
          unsigned_short Zsize)

{
  reference pvVar1;
  reference pvVar2;
  ulong local_30;
  uint64_t it;
  unsigned_short Zsize_local;
  unsigned_short Ysize_local;
  unsigned_short Xsize_local;
  Field<unsigned_long,_unsigned_short> *this_local;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&this->_grid);
  std::vector<CellLabel,_std::allocator<CellLabel>_>::vector(&this->_label);
  this->_Xsize = Xsize;
  this->_Ysize = Ysize;
  this->_Zsize = Zsize;
  if (Config::dim == 2) {
    this->_Zsize = 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->_grid,(long)(int)((uint)this->_Xsize * (uint)this->_Ysize * (uint)this->_Zsize))
  ;
  std::vector<CellLabel,_std::allocator<CellLabel>_>::resize
            (&this->_label,(long)(int)((uint)this->_Xsize * (uint)this->_Ysize * (uint)this->_Zsize)
            );
  for (local_30 = 0;
      local_30 < (ulong)(long)(int)((uint)this->_Xsize * (uint)this->_Ysize * (uint)this->_Zsize);
      local_30 = local_30 + 1) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->_grid,local_30);
    *pvVar1 = 0;
    pvVar2 = std::vector<CellLabel,_std::allocator<CellLabel>_>::operator[](&this->_label,local_30);
    *pvVar2 = EMPTY;
  }
  this->_maxIt = (long)(int)((uint)this->_Xsize * (uint)this->_Ysize * (uint)this->_Zsize);
  return;
}

Assistant:

explicit Field(U Xsize, U Ysize, U Zsize)
        : _Xsize(Xsize)
        , _Ysize(Ysize)
        , _Zsize(Zsize)
    {
        if (Config::dim == 2)
        {
            _Zsize = 1;
        }
        _grid.resize(_Xsize*_Ysize*_Zsize);
        _label.resize(_Xsize*_Ysize*_Zsize);
        for (std::uint64_t it = 0; it < _Xsize*_Ysize*_Zsize; ++it)
        {
            _grid[it] = 0;
            _label[it] = EMPTY;
        }
        _maxIt = _Xsize*_Ysize*_Zsize;
    }